

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O2

int ffdrws(fitsfile *fptr,long *rownum,long nrows,int *status)

{
  long *plVar1;
  void *buffer;
  int iVar2;
  FITSfile *pFVar3;
  long lVar4;
  LONGLONG LVar5;
  long bytepos;
  long lVar6;
  char *pcVar7;
  long lVar8;
  LONGLONG naxis1;
  void *local_b0;
  LONGLONG naxis2;
  long local_a0;
  LONGLONG local_98;
  long local_90;
  char comm [73];
  
  if (0 < *status) {
    return *status;
  }
  pFVar3 = fptr->Fptr;
  if (fptr->HDUposition != pFVar3->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    pFVar3 = fptr->Fptr;
  }
  if (pFVar3->datastart == -1) {
    iVar2 = ffrdef(fptr,status);
    if (0 < iVar2) goto LAB_0012676e;
    pFVar3 = fptr->Fptr;
  }
  if (pFVar3->hdutype == 0) {
    ffpmsg("Can only delete rows in TABLE or BINTABLE extension (ffdrws)");
    *status = 0xeb;
    return 0xeb;
  }
  if (nrows < 0) {
    *status = 0x132;
    return 0x132;
  }
  if (nrows != 0) {
    ffgkyjj(fptr,"NAXIS1",&naxis1,comm,status);
    ffgkyjj(fptr,"NAXIS2",&naxis2,comm,status);
    LVar5 = naxis1;
    lVar8 = 1;
    while (nrows != lVar8) {
      lVar6 = lVar8 + -1;
      plVar1 = rownum + lVar8;
      lVar8 = lVar8 + 1;
      if (*plVar1 <= rownum[lVar6]) {
        pcVar7 = "row numbers are not in increasing order (ffdrws)";
LAB_001267c6:
        ffpmsg(pcVar7);
        *status = 0x133;
        return 0x133;
      }
    }
    lVar8 = *rownum;
    if (lVar8 < 1) {
      pcVar7 = "first row to delete is less than 1 (ffdrws)";
      goto LAB_001267c6;
    }
    if (naxis2 < rownum[nrows + -1]) {
      pcVar7 = "last row to delete exceeds size of table (ffdrws)";
      goto LAB_001267c6;
    }
    local_b0 = malloc(naxis1);
    if (local_b0 == (void *)0x0) {
      ffpmsg("malloc failed (ffdrws)");
      *status = 0x71;
      return 0x71;
    }
    bytepos = (lVar8 + -1) * LVar5 + fptr->Fptr->datastart;
    lVar6 = LVar5 + bytepos;
    lVar4 = 1;
    while (lVar8 = lVar8 + 1, lVar4 < nrows) {
      if (lVar8 < rownum[lVar4]) {
        local_a0 = lVar4;
        local_98 = lVar6;
        local_90 = lVar8;
        ffmbyt(fptr,lVar6,0,status);
        buffer = local_b0;
        ffgbyt(fptr,naxis1,local_b0,status);
        ffmbyt(fptr,bytepos,1,status);
        ffpbyt(fptr,naxis1,buffer,status);
        if (0 < *status) {
          pcVar7 = "error while copying good rows in table (ffdrws)";
          goto LAB_00126979;
        }
        bytepos = bytepos + naxis1;
        lVar4 = local_a0;
        LVar5 = naxis1;
        lVar6 = local_98;
        lVar8 = local_90;
      }
      else {
        lVar4 = lVar4 + 1;
      }
      lVar6 = lVar6 + LVar5;
    }
    for (; lVar8 <= naxis2; lVar8 = lVar8 + 1) {
      ffmbyt(fptr,lVar6,0,status);
      ffgbyt(fptr,naxis1,local_b0,status);
      ffmbyt(fptr,bytepos,1,status);
      ffpbyt(fptr,naxis1,local_b0,status);
      if (0 < *status) {
        pcVar7 = "failed to copy remaining rows in table (ffdrws)";
LAB_00126979:
        ffpmsg(pcVar7);
        free(local_b0);
        goto LAB_0012676e;
      }
      bytepos = bytepos + naxis1;
      lVar6 = lVar6 + naxis1;
    }
    free(local_b0);
    ffdrow(fptr,(naxis2 - nrows) + 1,nrows,status);
    ffcmph(fptr,status);
  }
LAB_0012676e:
  return *status;
}

Assistant:

int ffdrws(fitsfile *fptr,  /* I - FITS file pointer                        */
           long *rownum,    /* I - list of rows to delete (1 = first)       */
           long nrows,      /* I - number of rows to delete                 */
           int *status)     /* IO - error status                            */
/*
 delete the list of rows from the table (1 = first row of table).
*/
{
    LONGLONG naxis1, naxis2, insertpos, nextrowpos;
    long ii, nextrow;
    char comm[FLEN_COMMENT];
    unsigned char *buffer;

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    /* rescan header if data structure is undefined */
    if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               
            return(*status);

    if ((fptr->Fptr)->hdutype == IMAGE_HDU)
    {
        ffpmsg("Can only delete rows in TABLE or BINTABLE extension (ffdrws)");
        return(*status = NOT_TABLE);
    }

    if (nrows < 0 )
        return(*status = NEG_BYTES);
    else if (nrows == 0)
        return(*status);   /* no op, so just return */

    ffgkyjj(fptr, "NAXIS1", &naxis1, comm, status); /* row width   */
    ffgkyjj(fptr, "NAXIS2", &naxis2, comm, status); /* number of rows */

    /* check that input row list is in ascending order */
    for (ii = 1; ii < nrows; ii++)
    {
        if (rownum[ii - 1] >= rownum[ii])
        {
            ffpmsg("row numbers are not in increasing order (ffdrws)");
            return(*status = BAD_ROW_NUM);
        }
    }

    if (rownum[0] < 1)
    {
        ffpmsg("first row to delete is less than 1 (ffdrws)");
        return(*status = BAD_ROW_NUM);
    }
    else if (rownum[nrows - 1] > naxis2)
    {
        ffpmsg("last row to delete exceeds size of table (ffdrws)");
        return(*status = BAD_ROW_NUM);
    }

    buffer = (unsigned char *) malloc( (size_t) naxis1);  /* buffer for one row */

    if (!buffer)
    {
        ffpmsg("malloc failed (ffdrws)");
        return(*status = MEMORY_ALLOCATION);
    }

    /* byte location to start of first row to delete, and the next row */
    insertpos = (fptr->Fptr)->datastart + ((rownum[0] - 1) * naxis1);
    nextrowpos = insertpos + naxis1;
    nextrow = rownum[0] + 1;

    /* work through the list of rows to delete */
    for (ii = 1; ii < nrows; nextrow++, nextrowpos += naxis1)
    {
        if (nextrow < rownum[ii])  
        {   /* keep this row, so copy it to the new position */

            ffmbyt(fptr, nextrowpos, REPORT_EOF, status);
            ffgbyt(fptr, naxis1, buffer, status);  /* read the bytes */

            ffmbyt(fptr, insertpos, IGNORE_EOF, status);
            ffpbyt(fptr, naxis1, buffer, status);  /* write the bytes */

            if (*status > 0)
            {
                ffpmsg("error while copying good rows in table (ffdrws)");
                free(buffer);
                return(*status);
            }
            insertpos += naxis1;
        }
        else
        {   /* skip over this row since it is in the list */
            ii++;
        }
    }

    /* finished with all the rows to delete; copy remaining rows */
    while(nextrow <= naxis2)
    {
        ffmbyt(fptr, nextrowpos, REPORT_EOF, status);
        ffgbyt(fptr, naxis1, buffer, status);  /* read the bytes */

        ffmbyt(fptr, insertpos, IGNORE_EOF, status);
        ffpbyt(fptr, naxis1, buffer, status);  /* write the bytes */

        if (*status > 0)
        {
            ffpmsg("failed to copy remaining rows in table (ffdrws)");
            free(buffer);
            return(*status);
        }
        insertpos  += naxis1;
        nextrowpos += naxis1;
        nextrow++; 
    }
    free(buffer);
    
    /* now delete the empty rows at the end of the table */
    ffdrow(fptr, naxis2 - nrows + 1, nrows, status);

    /* Update the heap data, if any.  This will remove any orphaned data */
    /* that was only pointed to by the rows that have been deleted */
    ffcmph(fptr, status);
    
    return(*status);
}